

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::DeformableConv2D_x86_avx::destroy_pipeline(DeformableConv2D_x86_avx *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x1e0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x1e0) + 0x28))(*(long **)(in_RDI + 0x1e0),in_RSI);
    if (*(long **)(in_RDI + 0x1e0) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x1e0) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x1e0) = 0;
  }
  if (*(long *)(in_RDI + 0x230) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x230) + 0x28))(*(long **)(in_RDI + 0x230),in_RSI);
    if (*(long **)(in_RDI + 0x230) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x230) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x230) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_avx::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}